

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

nn_cmsghdr * nn_cmsg_nxthdr_(nn_msghdr *mhdr,nn_cmsghdr *cmsg)

{
  size_t headsz;
  nn_cmsghdr *next;
  size_t sz;
  char *data;
  nn_cmsghdr *cmsg_local;
  nn_msghdr *mhdr_local;
  
  if (mhdr == (nn_msghdr *)0x0) {
    mhdr_local = (nn_msghdr *)0x0;
  }
  else {
    if (mhdr->msg_controllen == 0xffffffffffffffff) {
      sz = *mhdr->msg_control;
      next = (nn_cmsghdr *)nn_chunk_size((void *)sz);
    }
    else {
      sz = (size_t)mhdr->msg_control;
      next = (nn_cmsghdr *)mhdr->msg_controllen;
    }
    if (next < (nn_cmsghdr *)0x10) {
      mhdr_local = (nn_msghdr *)0x0;
    }
    else {
      if (cmsg == (nn_cmsghdr *)0x0) {
        headsz = sz;
      }
      else {
        headsz = (long)&cmsg->cmsg_len + (cmsg->cmsg_len + 7 & 0xfffffffffffffff8);
      }
      if ((next < (nn_cmsghdr *)((headsz - sz) + 0x10)) ||
         (next < (nn_cmsghdr *)((headsz - sz) + (*(long *)headsz + 7U & 0xfffffffffffffff8)))) {
        mhdr_local = (nn_msghdr *)0x0;
      }
      else {
        mhdr_local = (nn_msghdr *)headsz;
      }
    }
  }
  return (nn_cmsghdr *)mhdr_local;
}

Assistant:

struct nn_cmsghdr *nn_cmsg_nxthdr_ (const struct nn_msghdr *mhdr,
    const struct nn_cmsghdr *cmsg)
{
    char *data;
    size_t sz;
    struct nn_cmsghdr *next;
    size_t headsz;

    /*  Early return if no message is provided. */
    if (nn_slow (mhdr == NULL))
        return NULL;

    /*  Get the actual data. */
    if (mhdr->msg_controllen == NN_MSG) {
        data = *((void**) mhdr->msg_control);
        sz = nn_chunk_size (data);
    }
    else {
        data = (char*) mhdr->msg_control;
        sz = mhdr->msg_controllen;
    }

    /*  Ancillary data allocation was not even large enough for one element. */
    if (nn_slow (sz < NN_CMSG_SPACE (0)))
        return NULL;

    /*  If cmsg is set to NULL we are going to return first property.
        Otherwise move to the next property. */
    if (!cmsg)
        next = (struct nn_cmsghdr*) data;
    else
        next = (struct nn_cmsghdr*)
            (((char*) cmsg) + NN_CMSG_ALIGN_ (cmsg->cmsg_len));

    /*  If there's no space for next property, treat it as the end
        of the property list. */
    headsz = ((char*) next) - data;
    if (headsz + NN_CMSG_SPACE (0) > sz ||
          headsz + NN_CMSG_ALIGN_ (next->cmsg_len) > sz)
        return NULL;
    
    /*  Success. */
    return next;
}